

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# E.h
# Opt level: O0

void __thiscall E::~E(E *this)

{
  void *in_RDI;
  
  ~E((E *)0x112288);
  operator_delete(in_RDI,0x28);
  return;
}

Assistant:

virtual ~E(){}